

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergePartialFromCodedStream
          (KNearestNeighborsClassifier *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  NearestNeighborsIndex *value;
  Int64Parameter *value_00;
  StringVector *value_01;
  Int64Vector *value_02;
  string *value_03;
  char *data;
  UniformWeighting *value_04;
  InverseDistanceWeighting *value_05;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  KNearestNeighborsClassifier *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_0085219b:
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_0085231a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0085231a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_00852694:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) == 10) {
          value = mutable_nearestneighborsindex(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::NearestNeighborsIndex>(input,value);
          goto joined_r0x00852688;
        }
        goto LAB_00852694;
      }
      if (iVar2 == 3) {
        if ((tag_00 & 0xff) == 0x1a) {
          value_00 = mutable_numberofneighbors(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::Int64Parameter>(input,value_00);
          goto joined_r0x00852688;
        }
        goto LAB_00852694;
      }
      if (iVar2 == 100) {
        if ((tag_00 & 0xff) == 0x22) {
          value_01 = mutable_stringclasslabels(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_01);
          goto joined_r0x00852688;
        }
        goto LAB_00852694;
      }
      if (iVar2 == 0x65) {
        if ((tag_00 & 0xff) == 0x2a) {
          value_02 = mutable_int64classlabels(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_02);
          goto joined_r0x00852688;
        }
        goto LAB_00852694;
      }
      if (iVar2 == 0x6e) {
        if ((tag_00 & 0xff) == 0x72) {
          value_03 = mutable_defaultstringlabel_abi_cxx11_(this);
          bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,value_03);
          if (!bVar1) {
            return false;
          }
          defaultstringlabel_abi_cxx11_(this);
          data = (char *)std::__cxx11::string::data();
          defaultstringlabel_abi_cxx11_(this);
          iVar2 = std::__cxx11::string::length();
          bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (data,iVar2,PARSE,
                             "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
          goto joined_r0x00852688;
        }
        goto LAB_00852694;
      }
      if (iVar2 == 0x6f) {
        if ((tag_00 & 0xff) != 0x78) goto LAB_00852694;
        clear_DefaultClassLabel(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&(this->DefaultClassLabel_).defaultint64label_);
        if (!bVar1) {
          return false;
        }
        set_has_defaultint64label(this);
        goto LAB_0085219b;
      }
      if (iVar2 == 200) {
        if ((tag_00 & 0xff) != 0x42) goto LAB_00852694;
        value_04 = mutable_uniformweighting(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::UniformWeighting>(input,value_04);
      }
      else {
        if ((iVar2 != 0xd2) || ((tag_00 & 0xff) != 0x92)) goto LAB_00852694;
        value_05 = mutable_inversedistanceweighting(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::InverseDistanceWeighting>
                          (input,value_05);
      }
    }
joined_r0x00852688:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool KNearestNeighborsClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.KNearestNeighborsClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nearestneighborsindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_numberofneighbors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string defaultStringLabel = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_defaultstringlabel()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->defaultstringlabel().data(), this->defaultstringlabel().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 defaultInt64Label = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(888u)) {
          clear_DefaultClassLabel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &DefaultClassLabel_.defaultint64label_)));
          set_has_defaultint64label();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_uniformweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inversedistanceweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.KNearestNeighborsClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.KNearestNeighborsClassifier)
  return false;
#undef DO_
}